

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjedi_index_impl.h
# Opt level: O1

void __thiscall
json::QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
step_one(QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
         *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *cost_matrix,unsigned_long *matrix_size,int *step)

{
  unsigned_long uVar1;
  pointer pvVar2;
  double *pdVar3;
  unsigned_long uVar4;
  unsigned_long c;
  unsigned_long uVar5;
  double dVar6;
  double dVar7;
  
  uVar1 = *matrix_size;
  if (uVar1 != 0) {
    pvVar2 = (cost_matrix->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      pdVar3 = pvVar2[uVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      dVar6 = *pdVar3;
      do {
        dVar7 = pdVar3[uVar5];
        if (dVar6 <= pdVar3[uVar5]) {
          dVar7 = dVar6;
        }
        uVar5 = uVar5 + 1;
        dVar6 = dVar7;
      } while (uVar1 != uVar5);
      uVar5 = 0;
      do {
        pdVar3[uVar5] = pdVar3[uVar5] - dVar7;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar1);
  }
  *step = 2;
  return;
}

Assistant:

void QuickJEDITreeIndex<cost_matrixModel, TreeIndex>::step_one(
    std::vector<std::vector<double> >& cost_matrix,
    unsigned long& matrix_size,
    int& step)
{
  double min_in_row;
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    min_in_row = cost_matrix[r][0];
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (cost_matrix[r][c] < min_in_row)
      {
        min_in_row = cost_matrix[r][c];
      }
    }
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      cost_matrix[r][c] -= min_in_row;
    }
  }
  step = 2;
}